

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc_cord_state.cc
# Opt level: O3

void __thiscall absl::lts_20250127::crc_internal::CrcCordState::CrcCordState(CrcCordState *this)

{
  RefcountedRep *pRVar1;
  
  pRVar1 = (RefcountedRep *)operator_new(0x68);
  (pRVar1->count).super___atomic_base<int>._M_i = 1;
  (pRVar1->rep).removed_prefix.length = 0;
  (pRVar1->rep).removed_prefix.crc.crc_ = 0;
  (pRVar1->rep).prefix_crc.
  super__Deque_base<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc,_std::allocator<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (pRVar1->rep).prefix_crc.
  super__Deque_base<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc,_std::allocator<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  (pRVar1->rep).prefix_crc.
  super__Deque_base<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc,_std::allocator<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (pRVar1->rep).prefix_crc.
  super__Deque_base<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc,_std::allocator<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (pRVar1->rep).prefix_crc.
  super__Deque_base<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc,_std::allocator<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (pRVar1->rep).prefix_crc.
  super__Deque_base<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc,_std::allocator<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (pRVar1->rep).prefix_crc.
  super__Deque_base<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc,_std::allocator<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (pRVar1->rep).prefix_crc.
  super__Deque_base<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc,_std::allocator<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (pRVar1->rep).prefix_crc.
  super__Deque_base<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc,_std::allocator<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (pRVar1->rep).prefix_crc.
  super__Deque_base<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc,_std::allocator<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::
  _Deque_base<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc,_std::allocator<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc>_>
  ::_M_initialize_map(&(pRVar1->rep).prefix_crc.
                       super__Deque_base<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc,_std::allocator<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc>_>
                      ,0);
  this->refcounted_rep_ = pRVar1;
  return;
}

Assistant:

CrcCordState::CrcCordState() : refcounted_rep_(new RefcountedRep) {}